

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::ringbuffer_sink
          (ringbuffer_sink<std::mutex> *this,size_t n_items)

{
  undefined8 *in_RDI;
  base_sink<std::mutex> *unaff_retaddr;
  size_t in_stack_00000008;
  circular_q<spdlog::details::log_msg_buffer> *in_stack_00000010;
  
  base_sink<std::mutex>::base_sink(unaff_retaddr);
  *in_RDI = &PTR__ringbuffer_sink_0052d728;
  details::circular_q<spdlog::details::log_msg_buffer>::circular_q
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

explicit ringbuffer_sink(size_t n_items)
        : q_{n_items}
    {}